

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawImageObjectUtil.cpp
# Opt level: O0

void __thiscall
vkt::Draw::Image::uploadUsingBuffer
          (Image *this,VkQueue queue,Allocator *allocator,VkImageLayout layout,VkOffset3D offset,
          int width,int height,int depth,uint mipLevel,uint arrayElement,
          VkImageAspectFlagBits aspect,void *data)

{
  DeviceInterface *pDVar1;
  VkDevice pVVar2;
  VkCommandBuffer_s *pVVar3;
  RefData<vk::Handle<(vk::HandleType)24>_> data_00;
  RefData<vk::VkCommandBuffer_s_*> data_01;
  int iVar4;
  VkResult VVar5;
  Buffer *pBVar6;
  void *dst;
  VkDeviceSize offset_00;
  Handle<(vk::HandleType)24> *pHVar7;
  VkCommandBuffer_s **ppVVar8;
  VkBuffer VVar9;
  Handle<(vk::HandleType)6> local_350;
  undefined8 uStack_348;
  VkSubmitInfo submitInfo;
  undefined8 local_2f0;
  VkBufferImageCopy region;
  undefined1 local_2b0 [8];
  VkImageMemoryBarrier barrier;
  CmdBufferBeginInfo beginInfo;
  Move<vk::VkCommandBuffer_s_*> local_240;
  RefData<vk::VkCommandBuffer_s_*> local_220;
  undefined1 local_200 [8];
  Unique<vk::VkCommandBuffer_s_*> copyCmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_1c0;
  undefined1 local_1a0 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> copyCmdPool;
  CmdPoolCreateInfo copyCmdPoolCreateInfo;
  Allocation local_148;
  VkDeviceMemory local_128;
  Allocation local_120;
  void *local_100;
  deUint8 *destPtr;
  undefined1 local_f0 [16];
  undefined1 local_e0 [8];
  BufferCreateInfo stagingBufferResourceCreateInfo;
  TextureFormat TStack_88;
  int pixelSize;
  VkDeviceSize local_80;
  VkDeviceSize bufferSize;
  TextureFormat local_64;
  byte local_59;
  undefined1 local_58 [7];
  bool isCombinedType;
  SharedPtr<vkt::Draw::Buffer> stagingResource;
  VkImageLayout layout_local;
  Allocator *allocator_local;
  VkQueue queue_local;
  Image *this_local;
  VkOffset3D offset_local;
  
  stagingResource.m_state._4_4_ = layout;
  de::SharedPtr<vkt::Draw::Buffer>::SharedPtr((SharedPtr<vkt::Draw::Buffer> *)local_58);
  local_64 = ::vk::mapVkFormat(this->m_format);
  local_59 = tcu::isCombinedDepthStencilType(local_64.type);
  local_80 = 0;
  if (!(bool)local_59) {
    TStack_88 = ::vk::mapVkFormat(this->m_format);
    iVar4 = tcu::TextureFormat::getPixelSize(&stack0xffffffffffffff78);
    local_80 = (VkDeviceSize)(iVar4 * width * height * depth);
  }
  if ((local_59 & 1) != 0) {
    stagingBufferResourceCreateInfo.m_queueFamilyIndices.
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = 0;
    switch(this->m_format) {
    case VK_FORMAT_X8_D24_UNORM_PACK32:
    case VK_FORMAT_D24_UNORM_S8_UINT:
      stagingBufferResourceCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      if (aspect == VK_IMAGE_ASPECT_DEPTH_BIT) {
        stagingBufferResourceCreateInfo.m_queueFamilyIndices.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 3;
      }
      break;
    default:
      break;
    case VK_FORMAT_D16_UNORM_S8_UINT:
      stagingBufferResourceCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      if (aspect == VK_IMAGE_ASPECT_DEPTH_BIT) {
        stagingBufferResourceCreateInfo.m_queueFamilyIndices.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 2;
      }
      break;
    case VK_FORMAT_D32_SFLOAT_S8_UINT:
      stagingBufferResourceCreateInfo.m_queueFamilyIndices.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      if (aspect == VK_IMAGE_ASPECT_DEPTH_BIT) {
        stagingBufferResourceCreateInfo.m_queueFamilyIndices.
        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ = 4;
      }
    }
    local_80 = (VkDeviceSize)
               (stagingBufferResourceCreateInfo.m_queueFamilyIndices.
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage._4_4_ * width * height * depth);
  }
  BufferCreateInfo::BufferCreateInfo
            ((BufferCreateInfo *)local_e0,local_80,3,VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  destPtr._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_f0,this->m_vk,this->m_device,(VkBufferCreateInfo *)local_e0,allocator,
             ::vk::MemoryRequirement::HostVisible);
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            ((SharedPtr<vkt::Draw::Buffer> *)local_58,(SharedPtr<vkt::Draw::Buffer> *)local_f0);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)local_f0);
  pBVar6 = de::SharedPtr<vkt::Draw::Buffer>::operator->((SharedPtr<vkt::Draw::Buffer> *)local_58);
  Draw::Buffer::getBoundMemory(&local_120,pBVar6);
  dst = ::vk::Allocation::getHostPtr(&local_120);
  ::vk::Allocation::~Allocation(&local_120);
  local_100 = dst;
  ::deMemcpy(dst,data,local_80);
  pDVar1 = this->m_vk;
  pVVar2 = this->m_device;
  pBVar6 = de::SharedPtr<vkt::Draw::Buffer>::operator->((SharedPtr<vkt::Draw::Buffer> *)local_58);
  Draw::Buffer::getBoundMemory(&local_148,pBVar6);
  local_128 = ::vk::Allocation::getMemory(&local_148);
  pBVar6 = de::SharedPtr<vkt::Draw::Buffer>::operator->((SharedPtr<vkt::Draw::Buffer> *)local_58);
  Draw::Buffer::getBoundMemory
            ((Allocation *)&copyCmdPoolCreateInfo.super_VkCommandPoolCreateInfo.flags,pBVar6);
  offset_00 = ::vk::Allocation::getOffset
                        ((Allocation *)&copyCmdPoolCreateInfo.super_VkCommandPoolCreateInfo.flags);
  ::vk::flushMappedMemoryRange(pDVar1,pVVar2,local_128,offset_00,local_80);
  ::vk::Allocation::~Allocation
            ((Allocation *)&copyCmdPoolCreateInfo.super_VkCommandPoolCreateInfo.flags);
  ::vk::Allocation::~Allocation(&local_148);
  CmdPoolCreateInfo::CmdPoolCreateInfo
            ((CmdPoolCreateInfo *)
             &copyCmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             0,2);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &copyCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,this->m_vk,
             this->m_device,
             (VkCommandPoolCreateInfo *)
             &copyCmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             (VkAllocationCallbacks *)0x0);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_1c0,
             (Move *)&copyCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_1c0.deleter.m_deviceIface;
  data_00.object.m_internal = local_1c0.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_1c0.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device = local_1c0.deleter.m_device;
  data_00.deleter.m_allocator._0_4_ = (int)local_1c0.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_1c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_1a0,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &copyCmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pDVar1 = this->m_vk;
  pVVar2 = this->m_device;
  pHVar7 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                     ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_1a0);
  ::vk::allocateCommandBuffer
            (&local_240,pDVar1,pVVar2,(VkCommandPool)pHVar7->m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_220,(Move *)&local_240);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_220.deleter.m_deviceIface;
  data_01.object = local_220.object;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_220.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device = local_220.deleter.m_device;
  data_01.deleter.m_pool.m_internal._0_4_ = (int)local_220.deleter.m_pool.m_internal;
  data_01.deleter.m_pool.m_internal._4_4_ = (int)(local_220.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_200,data_01);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_240);
  CmdBufferBeginInfo::CmdBufferBeginInfo
            ((CmdBufferBeginInfo *)&barrier.subresourceRange.layerCount,0);
  pDVar1 = this->m_vk;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_200);
  VVar5 = (*pDVar1->_vptr_DeviceInterface[0x49])
                    (pDVar1,*ppVVar8,&barrier.subresourceRange.layerCount);
  ::vk::checkResult(VVar5,"m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x2b3);
  if (stagingResource.m_state._4_4_ == VK_IMAGE_LAYOUT_UNDEFINED) {
    stagingResource.m_state._4_4_ = VK_IMAGE_LAYOUT_GENERAL;
    ::vk::VkImageMemoryBarrier::VkImageMemoryBarrier((VkImageMemoryBarrier *)local_2b0);
    local_2b0._0_4_ = VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
    barrier.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    barrier._4_4_ = 0;
    barrier.pNext._0_4_ = 0;
    barrier.pNext._4_4_ = 0;
    barrier.srcAccessMask = 0;
    barrier.dstAccessMask = 1;
    barrier.oldLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    barrier.newLayout = ~VK_IMAGE_LAYOUT_UNDEFINED;
    region.imageExtent._4_8_ = object(this);
    barrier.image.m_internal._0_4_ = aspect;
    barrier.image.m_internal._4_4_ = 0;
    barrier.subresourceRange.aspectMask = this->m_levelCount;
    barrier.subresourceRange.baseMipLevel = 0;
    barrier.subresourceRange.levelCount = this->m_layerCount;
    pDVar1 = this->m_vk;
    barrier._32_8_ = region.imageExtent._4_8_;
    ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                        ((RefBase<vk::VkCommandBuffer_s_*> *)local_200);
    (*pDVar1->_vptr_DeviceInterface[0x6d])(pDVar1,*ppVVar8,0x8000,1,0,0,0,0,0,1,local_2b0);
  }
  local_2f0 = 0;
  region.bufferOffset._0_4_ = 0;
  region.bufferOffset._4_4_ = 0;
  region.bufferRowLength = aspect;
  region.bufferImageHeight = mipLevel;
  region.imageSubresource.aspectMask = arrayElement;
  region.imageSubresource.mipLevel = 1;
  region.imageOffset.y = width;
  region.imageOffset.z = height;
  region.imageExtent.width = depth;
  pDVar1 = this->m_vk;
  region.imageSubresource._8_8_ = offset._0_8_;
  region.imageOffset.x = offset.z;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_200);
  pVVar3 = *ppVVar8;
  pBVar6 = de::SharedPtr<vkt::Draw::Buffer>::operator->((SharedPtr<vkt::Draw::Buffer> *)local_58);
  VVar9 = Draw::Buffer::object(pBVar6);
  submitInfo.pSignalSemaphores = (VkSemaphore *)object(this);
  (*pDVar1->_vptr_DeviceInterface[0x62])
            (pDVar1,pVVar3,VVar9.m_internal,submitInfo.pSignalSemaphores,
             (ulong)stagingResource.m_state._4_4_,1,(int)&local_2f0);
  pDVar1 = this->m_vk;
  ppVVar8 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                      ((RefBase<vk::VkCommandBuffer_s_*> *)local_200);
  VVar5 = (*pDVar1->_vptr_DeviceInterface[0x4a])(pDVar1,*ppVVar8);
  ::vk::checkResult(VVar5,"m_vk.endCommandBuffer(*copyCmdBuffer)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x2d9);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_348 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 ((RefBase<vk::VkCommandBuffer_s_*> *)local_200);
  pDVar1 = this->m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle(&local_350,0);
  (*pDVar1->_vptr_DeviceInterface[2])(pDVar1,queue,1,&uStack_348,local_350.m_internal);
  VVar5 = (*this->m_vk->_vptr_DeviceInterface[3])(this->m_vk,queue);
  ::vk::checkResult(VVar5,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawImageObjectUtil.cpp"
                    ,0x2ea);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_200);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_1a0);
  BufferCreateInfo::~BufferCreateInfo((BufferCreateInfo *)local_e0);
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)local_58);
  return;
}

Assistant:

void Image::uploadUsingBuffer (vk::VkQueue					queue,
							   vk::Allocator&				allocator,
							   vk::VkImageLayout			layout,
							   vk::VkOffset3D				offset,
							   int							width,
							   int							height,
							   int							depth,
							   unsigned int					mipLevel,
							   unsigned int					arrayElement,
							   vk::VkImageAspectFlagBits	aspect,
							   const void *					data)
{
	DE_ASSERT(layout == vk::VK_IMAGE_LAYOUT_GENERAL || layout == vk::VK_IMAGE_LAYOUT_UNDEFINED || layout == vk::VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL);

	de::SharedPtr<Buffer> stagingResource;
	bool isCombinedType = isCombinedDepthStencilType(vk::mapVkFormat(m_format).type);
	vk::VkDeviceSize bufferSize = 0;
	if (!isCombinedType)
		bufferSize = vk::mapVkFormat(m_format).getPixelSize() *width*height*depth;
	if (isCombinedType)
	{
		int pixelSize = 0;
		switch (m_format)
		{
			case vk::VK_FORMAT_D16_UNORM_S8_UINT:
				pixelSize = (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT) ? 2 : 1;
				break;
			case  vk::VK_FORMAT_D32_SFLOAT_S8_UINT:
				pixelSize = (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT) ? 4 : 1;
				break;
			case vk::VK_FORMAT_X8_D24_UNORM_PACK32:
			case vk::VK_FORMAT_D24_UNORM_S8_UINT:
				pixelSize = (aspect == vk::VK_IMAGE_ASPECT_DEPTH_BIT) ? 3 : 1;
				break;

			default:
				DE_FATAL("Not implemented");
		}
		bufferSize = pixelSize*width*height*depth;
	}
	BufferCreateInfo stagingBufferResourceCreateInfo(bufferSize, vk::VK_BUFFER_USAGE_TRANSFER_DST_BIT | vk::VK_BUFFER_USAGE_TRANSFER_SRC_BIT);
	stagingResource = Buffer::createAndAlloc(m_vk, m_device, stagingBufferResourceCreateInfo, allocator, vk::MemoryRequirement::HostVisible);
	deUint8* destPtr = reinterpret_cast<deUint8*>(stagingResource->getBoundMemory().getHostPtr());
	deMemcpy(destPtr, data, static_cast<size_t>(bufferSize));
	vk::flushMappedMemoryRange(m_vk, m_device, stagingResource->getBoundMemory().getMemory(), stagingResource->getBoundMemory().getOffset(), bufferSize);
	{
		//todo [scygan] get proper queueFamilyIndex
		CmdPoolCreateInfo copyCmdPoolCreateInfo(0);
		vk::Unique<vk::VkCommandPool> copyCmdPool(vk::createCommandPool(m_vk, m_device, &copyCmdPoolCreateInfo));
		vk::Unique<vk::VkCommandBuffer> copyCmdBuffer(vk::allocateCommandBuffer(m_vk, m_device, *copyCmdPool, vk::VK_COMMAND_BUFFER_LEVEL_PRIMARY));

		CmdBufferBeginInfo beginInfo;
		VK_CHECK(m_vk.beginCommandBuffer(*copyCmdBuffer, &beginInfo));

		if (layout == vk::VK_IMAGE_LAYOUT_UNDEFINED)
		{
			layout = vk::VK_IMAGE_LAYOUT_GENERAL;

			vk::VkImageMemoryBarrier barrier;
			barrier.sType = vk::VK_STRUCTURE_TYPE_IMAGE_MEMORY_BARRIER;
			barrier.pNext = DE_NULL;
			barrier.srcAccessMask = 0;
			barrier.dstAccessMask = 0;
			barrier.oldLayout = vk::VK_IMAGE_LAYOUT_UNDEFINED;
			barrier.newLayout = vk::VK_IMAGE_LAYOUT_GENERAL;
			barrier.srcQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED;
			barrier.dstQueueFamilyIndex = VK_QUEUE_FAMILY_IGNORED;
			barrier.image = object();

			barrier.subresourceRange.aspectMask = aspect;
			barrier.subresourceRange.baseMipLevel = 0;
			barrier.subresourceRange.levelCount = m_levelCount;
			barrier.subresourceRange.baseArrayLayer = 0;
			barrier.subresourceRange.layerCount = m_layerCount;

			m_vk.cmdPipelineBarrier(*copyCmdBuffer, vk::VK_PIPELINE_STAGE_ALL_GRAPHICS_BIT, vk::VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, (vk::VkDependencyFlags)0,
									0, (const vk::VkMemoryBarrier*)DE_NULL,
									0, (const vk::VkBufferMemoryBarrier*)DE_NULL,
									1, &barrier);
		}

		vk::VkBufferImageCopy region = {
			0, 0, 0,
			{ (vk::VkImageAspectFlags)aspect, mipLevel, arrayElement, 1 },
			offset,
			{ (deUint32)width, (deUint32)height, (deUint32)depth }
		};

		m_vk.cmdCopyBufferToImage(*copyCmdBuffer, stagingResource->object(),
			object(), layout, 1, &region);
		VK_CHECK(m_vk.endCommandBuffer(*copyCmdBuffer));

		vk::VkSubmitInfo submitInfo =
		{
			vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
			DE_NULL,							// const void*				pNext;
			0,									// deUint32					waitSemaphoreCount;
			DE_NULL,							// const VkSemaphore*		pWaitSemaphores;
			(const vk::VkPipelineStageFlags*)DE_NULL,
			1,									// deUint32					commandBufferCount;
			&copyCmdBuffer.get(),				// const VkCommandBuffer*	pCommandBuffers;
			0,									// deUint32					signalSemaphoreCount;
			DE_NULL								// const VkSemaphore*		pSignalSemaphores;
		};
		m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL);

		// TODO: make this less intrusive
		VK_CHECK(m_vk.queueWaitIdle(queue));
	}
}